

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

btScalar EdgeSeparation(btBox2dShape *poly1,btTransform *xf1,int edge1,btBox2dShape *poly2,
                       btTransform *xf2)

{
  btBox2dShape *in_RCX;
  btTransform *in_RSI;
  btBox2dShape *in_RDI;
  btTransform *in_R8;
  btScalar bVar1;
  btScalar separation;
  btVector3 v2;
  btVector3 v1;
  btScalar minDot;
  int index;
  btVector3 normal1;
  btVector3 normal1World;
  btVector3 *vertices2;
  int count2;
  btVector3 *normals1;
  btVector3 *vertices1;
  btVector3 *in_stack_ffffffffffffff18;
  btTransform *this;
  undefined4 in_stack_ffffffffffffff28;
  btScalar in_stack_ffffffffffffff2c;
  btMatrix3x3 *in_stack_ffffffffffffff30;
  btScalar in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  btVector3 *in_stack_ffffffffffffff40;
  btMatrix3x3 *in_stack_ffffffffffffff80;
  btVector3 local_58;
  btVector3 *local_48;
  int local_3c;
  btVector3 *local_38;
  btVector3 *local_30;
  btTransform *local_28;
  btBox2dShape *local_20;
  btTransform *local_10;
  btBox2dShape *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = btBox2dShape::getVertices(in_RDI);
  local_38 = btBox2dShape::getNormals(local_8);
  local_3c = btBox2dShape::getVertexCount(local_20);
  local_48 = btBox2dShape::getVertices(local_20);
  btTransform::getBasis(local_10);
  local_58 = operator*(in_stack_ffffffffffffff30,
                       (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  btTransform::getBasis(local_28);
  this = (btTransform *)&stack0xffffffffffffff68;
  btMatrix3x3::transpose(in_stack_ffffffffffffff80);
  operator*(in_stack_ffffffffffffff30,
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (0 < local_3c) {
    btVector3::minDot(in_stack_ffffffffffffff40,
                      (btVector3 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      (long)in_stack_ffffffffffffff30,
                      (btScalar *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  btTransform::operator*(this,in_stack_ffffffffffffff18);
  btTransform::operator*(this,in_stack_ffffffffffffff18);
  operator-(in_stack_ffffffffffffff30->m_el,
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = btVector3::dot((btVector3 *)&stack0xffffffffffffff2c,&local_58);
  return bVar1;
}

Assistant:

static btScalar EdgeSeparation(const btBox2dShape* poly1, const btTransform& xf1, int edge1,
							  const btBox2dShape* poly2, const btTransform& xf2)
{
	const btVector3* vertices1 = poly1->getVertices();
	const btVector3* normals1 = poly1->getNormals();

	int count2 = poly2->getVertexCount();
	const btVector3* vertices2 = poly2->getVertices();

	btAssert(0 <= edge1 && edge1 < poly1->getVertexCount());

	// Convert normal from poly1's frame into poly2's frame.
	btVector3 normal1World = b2Mul(xf1.getBasis(), normals1[edge1]);
	btVector3 normal1 = b2MulT(xf2.getBasis(), normal1World);

	// Find support vertex on poly2 for -normal.
	int index = 0;
	btScalar minDot = BT_LARGE_FLOAT;

    if( count2 > 0 )
        index = (int) normal1.minDot( vertices2, count2, minDot);

	btVector3 v1 = b2Mul(xf1, vertices1[edge1]);
	btVector3 v2 = b2Mul(xf2, vertices2[index]);
	btScalar separation = b2Dot(v2 - v1, normal1World);
	return separation;
}